

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

double __thiscall units::uncertain_measurement::fractional_uncertainty(uncertain_measurement *this)

{
  double dVar1;
  float local_24;
  uncertain_measurement *this_local;
  
  dVar1 = uncertainty(this);
  if (this->value_ < 0.0) {
    local_24 = -this->value_;
  }
  else {
    local_24 = this->value_;
  }
  return dVar1 / (double)local_24;
}

Assistant:

constexpr double fractional_uncertainty() const
    {
        return uncertainty() /
            static_cast<double>((value_ >= 0.0F) ? value_ : -value_);
    }